

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O3

DdNode * Abc_NtkBddCofactors_rec(DdManager *dd,DdNode *bNode,int iCof,int iLevel,int nLevels)

{
  anon_union_16_2_50f58667_for_type *paVar1;
  uint i;
  int iVar2;
  DdNode *node;
  uint uVar3;
  int *piVar4;
  bool bVar5;
  
  if ((iLevel != nLevels) &&
     (piVar4 = (int *)((ulong)bNode & 0xfffffffffffffffe), *piVar4 != 0x7fffffff)) {
    uVar3 = ~iLevel + nLevels;
    node = bNode;
    do {
      i = Cudd_NodeReadIndex(node);
      iVar2 = Cudd_ReadPerm(dd,i);
      bNode = node;
      if (iVar2 <= iLevel) {
        if (((ulong)node & 1) == 0) {
          paVar1 = &node->type;
          node = (node->type).kids.T;
          bNode = (paVar1->kids).E;
        }
        else {
          node = (DdNode *)(*(ulong *)(piVar4 + 4) ^ 1);
          bNode = (DdNode *)(*(ulong *)(piVar4 + 6) ^ 1);
        }
      }
      if (((uint)iCof >> (uVar3 & 0x1f) & 1) != 0) {
        bNode = node;
      }
      bVar5 = uVar3 == 0;
      uVar3 = uVar3 - 1;
      if (bVar5) {
        return bNode;
      }
      iLevel = iLevel + 1;
      piVar4 = (int *)((ulong)bNode & 0xfffffffffffffffe);
      node = bNode;
    } while (*piVar4 != 0x7fffffff);
  }
  return bNode;
}

Assistant:

DdNode * Abc_NtkBddCofactors_rec( DdManager * dd, DdNode * bNode, int iCof, int iLevel, int nLevels )
{
    DdNode * bNode0, * bNode1;
    if ( Cudd_IsConstant(bNode) || iLevel == nLevels )
        return bNode;
    if ( Cudd_ReadPerm( dd, Cudd_NodeReadIndex(bNode) ) > iLevel )
    {
        bNode0 = bNode;
        bNode1 = bNode;
    }
    else if ( Cudd_IsComplement(bNode) )
    {
        bNode0 = Cudd_Not(cuddE(Cudd_Regular(bNode)));
        bNode1 = Cudd_Not(cuddT(Cudd_Regular(bNode)));
    }
    else
    {
        bNode0 = cuddE(bNode);
        bNode1 = cuddT(bNode);
    }
    if ( (iCof >> (nLevels-1-iLevel)) & 1 )
        return Abc_NtkBddCofactors_rec( dd, bNode1, iCof, iLevel + 1, nLevels );
    return Abc_NtkBddCofactors_rec( dd, bNode0, iCof, iLevel + 1, nLevels );
}